

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defopcode.c
# Opt level: O2

int compute_dashmask(char *pattern)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  sVar1 = strlen(pattern);
  uVar5 = 0;
  if (0 < (int)sVar1) {
    uVar5 = sVar1 & 0xffffffff;
  }
  lVar2 = sVar1 << 0x20;
  uVar4 = 0;
  for (uVar3 = 0; lVar2 = lVar2 + -0x100000000, uVar5 != uVar3; uVar3 = uVar3 + 1) {
    uVar6 = 1 << ((byte)uVar3 & 0x1f);
    if (pattern[lVar2 >> 0x20] != '-') {
      uVar6 = 0;
    }
    uVar4 = uVar4 | uVar6;
  }
  return uVar4;
}

Assistant:

static int
compute_dashmask (const char *pattern)
{
  int i, mask = 0, len = strlen (pattern);

  for (i = 0; i < len; i++)
    if (pattern[len - 1 - i] == '-')
      mask |= (1 << i);
  return mask;
}